

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_context_randomize(secp256k1_context *ctx,uchar *seed32)

{
  bool bVar1;
  
  bVar1 = (ctx->ecmult_gen_ctx).built == 0;
  if (bVar1) {
    secp256k1_context_randomize_cold_1();
  }
  else {
    secp256k1_ecmult_gen_blind(&ctx->ecmult_gen_ctx,seed32);
  }
  return (uint)!bVar1;
}

Assistant:

int secp256k1_context_randomize(secp256k1_context* ctx, const unsigned char *seed32) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    if (secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)) {
        secp256k1_ecmult_gen_blind(&ctx->ecmult_gen_ctx, seed32);
    }
    return 1;
}